

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O0

bool jsoncons::detail::dtoa_fixed<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_1,
               char param_2,undefined8 param_3)

{
  bool bVar1;
  char cVar2;
  double u;
  char buffer [100];
  int k;
  int length;
  undefined8 local_b0;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  size_t in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  undefined1 local_1;
  
  cVar2 = (char)param_3;
  if (((double)param_1 != 0.0) || (NAN((double)param_1))) {
    bVar1 = std::signbit((double)param_1);
    local_b0 = param_1;
    if (bVar1) {
      local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong)param_1 ^ 0x8000000000000000);
    }
    bVar1 = grisu3(stack0x00000090,(char *)buffer._88_8_,(int *)buffer._80_8_,(int *)buffer._72_8_);
    if (bVar1) {
      bVar1 = std::signbit((double)param_1);
      if (bVar1) {
        std::__cxx11::string::push_back(cVar2);
      }
      std::numeric_limits<int>::lowest();
      std::numeric_limits<int>::max();
      prettify_string<std::__cxx11::string>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                 in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,local_b0);
      local_1 = true;
    }
    else {
      local_1 = dtoa_fixed<std::__cxx11::string>(param_1,(int)param_2,param_3);
    }
  }
  else {
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar2);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool dtoa_fixed(double v, char decimal_point, Result& result, std::true_type)
    {
        if (v == 0)
        {
            result.push_back('0');
            result.push_back('.');
            result.push_back('0');
            return true;
        }

        int length = 0;
        int k;

        char buffer[100];

        double u = std::signbit(v) ? -v : v;
        if (jsoncons::detail::grisu3(u, buffer, &length, &k))
        {
            if (std::signbit(v))
            {
                result.push_back('-');
            }
            jsoncons::detail::prettify_string(buffer, length, k, std::numeric_limits<int>::lowest(), (std::numeric_limits<int>::max)(), result);
            return true;
        }
        else
        {
            return dtoa_fixed(v, decimal_point, result, std::false_type());
        }
    }